

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

bool google::protobuf::util::FieldMaskUtil::ToJsonString(FieldMask *mask,string *out)

{
  int iVar1;
  bool bVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar3;
  string *in_RCX;
  int index;
  string_view input;
  string camelcase_path;
  
  out->_M_string_length = 0;
  *(out->_M_dataplus)._M_p = '\0';
  index = 0;
  do {
    iVar1 = *(int *)((long)&mask->field_0 + 8);
    if (iVar1 <= index) {
LAB_00cc5770:
      return iVar1 <= index;
    }
    pVVar3 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       ((RepeatedPtrFieldBase *)&(mask->field_0)._impl_,index);
    camelcase_path._M_dataplus._M_p = (pointer)&camelcase_path.field_2;
    camelcase_path._M_string_length = 0;
    camelcase_path.field_2._M_local_buf[0] = '\0';
    input._M_str = (char *)&camelcase_path;
    input._M_len = (size_t)(pVVar3->_M_dataplus)._M_p;
    bVar2 = SnakeCaseToCamelCase((FieldMaskUtil *)pVVar3->_M_string_length,input,in_RCX);
    if (!bVar2) {
      std::__cxx11::string::~string((string *)&camelcase_path);
      goto LAB_00cc5770;
    }
    if (index != 0) {
      std::__cxx11::string::push_back((char)out);
    }
    std::__cxx11::string::append((string *)out);
    std::__cxx11::string::~string((string *)&camelcase_path);
    index = index + 1;
  } while( true );
}

Assistant:

bool FieldMaskUtil::ToJsonString(const FieldMask& mask, std::string* out) {
  out->clear();
  for (int i = 0; i < mask.paths_size(); ++i) {
    absl::string_view path = mask.paths(i);
    std::string camelcase_path;
    if (!SnakeCaseToCamelCase(path, &camelcase_path)) {
      return false;
    }
    if (i > 0) {
      out->push_back(',');
    }
    out->append(camelcase_path);
  }
  return true;
}